

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

void __thiscall
helics::FederateState::updateDataForExecEntry
          (FederateState *this,MessageProcessingResult result,IterationRequest iterate)

{
  TimeCoordinator *pTVar1;
  Time TVar2;
  pointer pIVar3;
  pointer puVar4;
  iterator iVar5;
  pointer puVar6;
  bool bVar7;
  InterfaceHandle *pIVar8;
  pointer puVar9;
  pointer puVar10;
  unique_lock<std::shared_mutex> uStack_40;
  
  this->mGrantCount = this->mGrantCount + 1;
  if (result == NEXT_STEP) {
    pTVar1 = (this->timeCoord)._M_t.
             super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
             .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
    (this->time_granted).internalTimeCode = (pTVar1->time_granted).internalTimeCode;
    (this->allowed_send_time).internalTimeCode =
         (pTVar1->info).outputDelay.internalTimeCode + (pTVar1->time_granted).internalTimeCode;
  }
  else {
    if (result == ERROR_RESULT) {
      return;
    }
    if (result != ITERATING) goto LAB_00313522;
    *(undefined4 *)&(this->time_granted).internalTimeCode = 0xffffffff;
    *(undefined4 *)((long)&(this->time_granted).internalTimeCode + 4) = 0xffffffff;
    *(undefined4 *)&(this->allowed_send_time).internalTimeCode = 0xffffffff;
    *(undefined4 *)((long)&(this->allowed_send_time).internalTimeCode + 4) = 0xffffffff;
  }
  if (result == ERROR_RESULT) {
    return;
  }
LAB_00313522:
  if (iterate == NO_ITERATIONS) {
    TVar2.internalTimeCode = (this->time_granted).internalTimeCode;
    if (this->wait_for_current_time == true) {
      pIVar3 = (this->events).
               super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->events).
          super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
          _M_impl.super__Vector_impl_data._M_finish != pIVar3) {
        (this->events).
        super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish = pIVar3;
      }
      uStack_40._M_device = &(this->interfaceInformation).inputs.m_mutex;
      uStack_40._M_owns = false;
      std::unique_lock<std::shared_mutex>::lock(&uStack_40);
      uStack_40._M_owns = true;
      puVar9 = (this->interfaceInformation).inputs.m_obj.dataStorage.
               super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar4 = *(pointer *)
                ((long)&(this->interfaceInformation).inputs.m_obj.dataStorage.
                        super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      if (puVar9 != puVar4) {
        do {
          bVar7 = InputInfo::updateTimeInclusive
                            ((puVar9->_M_t).
                             super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                             .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl,TVar2);
          if (bVar7) {
            pIVar8 = &(((puVar9->_M_t).
                        super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                        .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl)->id).handle
            ;
            iVar5._M_current =
                 (this->events).
                 super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->events).
                super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>>::
              _M_realloc_insert<helics::InterfaceHandle_const&>
                        ((vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>> *)
                         &this->events,iVar5,pIVar8);
            }
            else {
              (iVar5._M_current)->hid = pIVar8->hid;
              (this->events).
              super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
          }
          puVar9 = puVar9 + 1;
        } while (puVar9 != puVar4);
      }
      std::unique_lock<std::shared_mutex>::~unique_lock(&uStack_40);
      pIVar3 = (this->eventMessages).
               super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->eventMessages).
          super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
          _M_impl.super__Vector_impl_data._M_finish != pIVar3) {
        (this->eventMessages).
        super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish = pIVar3;
      }
      uStack_40._M_device = &(this->interfaceInformation).endpoints.m_mutex;
      uStack_40._M_owns = false;
      std::unique_lock<std::shared_mutex>::lock(&uStack_40);
      uStack_40._M_owns = true;
      puVar10 = (this->interfaceInformation).endpoints.m_obj.dataStorage.
                super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar6 = *(pointer *)
                ((long)&(this->interfaceInformation).endpoints.m_obj.dataStorage.
                        super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      if (puVar10 != puVar6) {
        do {
          bVar7 = EndpointInfo::updateTimeInclusive
                            ((puVar10->_M_t).
                             super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                             .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,
                             TVar2);
          if (bVar7) {
            pIVar8 = &(((puVar10->_M_t).
                        super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                        .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->id).
                      handle;
            iVar5._M_current =
                 (this->eventMessages).
                 super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->eventMessages).
                super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>>::
              _M_realloc_insert<helics::InterfaceHandle_const&>
                        ((vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>> *)
                         &this->eventMessages,iVar5,pIVar8);
            }
            else {
              (iVar5._M_current)->hid = pIVar8->hid;
              (this->eventMessages).
              super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
          }
          puVar10 = puVar10 + 1;
        } while (puVar10 != puVar6);
      }
      std::unique_lock<std::shared_mutex>::~unique_lock(&uStack_40);
      return;
    }
    fillEventVectorUpTo(this,TVar2);
    return;
  }
  if (iterate != ITERATE_IF_NEEDED) {
    if (iterate != FORCE_ITERATION) {
      return;
    }
    fillEventVectorNextIteration(this,(Time)(this->time_granted).internalTimeCode);
    return;
  }
  TVar2.internalTimeCode = (this->time_granted).internalTimeCode;
  if (result == NEXT_STEP) {
    fillEventVectorUpTo(this,TVar2);
    return;
  }
  fillEventVectorNextIteration(this,TVar2);
  return;
}

Assistant:

void FederateState::updateDataForExecEntry(MessageProcessingResult result, IterationRequest iterate)
{
    ++mGrantCount;
    if (result == MessageProcessingResult::NEXT_STEP) {
        time_granted = timeCoord->getGrantedTime();
        allowed_send_time = timeCoord->allowedSendTime();
    } else if (result == MessageProcessingResult::ITERATING) {
        time_granted = initializationTime;
        allowed_send_time = initializationTime;
    }
    if (result != MessageProcessingResult::ERROR_RESULT) {
        switch (iterate) {
            case IterationRequest::FORCE_ITERATION:
                fillEventVectorNextIteration(time_granted);
                break;
            case IterationRequest::ITERATE_IF_NEEDED:
                if (result == MessageProcessingResult::NEXT_STEP) {
                    fillEventVectorUpTo(time_granted);
                } else {
                    fillEventVectorNextIteration(time_granted);
                }
                break;
            case IterationRequest::NO_ITERATIONS:
                if (wait_for_current_time) {
                    fillEventVectorInclusive(time_granted);
                } else {
                    fillEventVectorUpTo(time_granted);
                }
                break;
            default:
                break;
        }
    }
}